

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_data.cpp
# Opt level: O2

Timestamp ot::commissioner::Timestamp::Cur(void)

{
  duration<long,_std::ratio<1L,_1000000L>_> dVar1;
  
  dVar1 = NowSinceEpoch<std::chrono::duration<long,std::ratio<1l,1000000l>>>();
  return (Timestamp)
         ((ulong)((uint)((dVar1.__r % 1000000 << 0xf) / 1000000) & 0x7fff) << 0x30 |
         dVar1.__r / 1000000 & 0xffffffffffffU);
}

Assistant:

Timestamp Timestamp::Cur()
{
    Timestamp cur;
    auto      now = NowSinceEpoch<std::chrono::microseconds>().count();
    cur.mSeconds  = now / 1000000;
    cur.mTicks    = (now % 1000000) * (1 << 15) / 1000000;

    // Not an authoritive source
    cur.mU = 0;

    return cur;
}